

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

stack * stack_new(int startingSize)

{
  stack *__ptr;
  void **ppvVar1;
  size_t sVar2;
  
  __ptr = (stack *)malloc(0x18);
  if (__ptr != (stack *)0x0) {
    sVar2 = 0x40;
    if (0 < startingSize) {
      sVar2 = (size_t)(uint)startingSize;
    }
    ppvVar1 = (void **)malloc(sVar2 * 8);
    __ptr->element = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      __ptr->size = 0;
      __ptr->capacity = sVar2;
      return __ptr;
    }
    free(__ptr);
  }
  return (stack *)0x0;
}

Assistant:

stack * stack_new(int startingSize) {
	stack * s = malloc(sizeof(stack));

	if (s) {
		if (startingSize <= 0) {
			startingSize = kStackStartingSize;
		}

		s->element = malloc(sizeof(void *) * startingSize);

		if (!s->element) {
			free(s);
			return NULL;
		}

		s->size = 0;
		s->capacity = startingSize;
	}

	return s;
}